

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

void __thiscall cppforth::Forth::OpenFilesSqeeze(Forth *this)

{
  pointer pFVar1;
  char cVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  uVar3 = ((long)(this->OpenFiles).
                 super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->OpenFiles).
                super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x38;
  lVar6 = (uVar3 & 0xffffffff) * 0x38;
  while( true ) {
    iVar7 = (int)uVar3;
    if (iVar7 < 1) break;
    pFVar1 = (this->OpenFiles).
             super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
             ._M_impl.super__Vector_impl_data._M_start;
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      lVar5 = (long)(this->OpenFiles).
                    super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1;
      lVar4 = lVar5 / 0x38;
      if (iVar7 < (int)lVar4) {
        std::swap<cppforth::Forth::ForthFile>
                  ((ForthFile *)((long)&pFVar1[-1].FILE + lVar6),
                   (ForthFile *)((long)pFVar1 + lVar5 + -0x38));
        lVar4 = ((long)(this->OpenFiles).
                       super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->OpenFiles).
                      super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x38;
      }
      std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::resize
                (&this->OpenFiles,lVar4 - 1);
    }
    uVar3 = (ulong)(iVar7 - 1);
    lVar6 = lVar6 + -0x38;
  }
  return;
}

Assistant:

void OpenFilesSqeeze(){
	for (int it = static_cast<int>(OpenFiles.size()) - 1; it >= 0; --it){
		if (!(OpenFiles[it].fileObject->is_open())){
			if (it < (static_cast<int>(OpenFiles.size()) - 1)){
				std::swap(OpenFiles[it], OpenFiles[OpenFiles.size() - 1]);
			}
			OpenFiles.resize(OpenFiles.size() - 1);
		}
	}
}